

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fmt_aliases.h
# Opt level: O0

bool date::
     read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,4ul,unsigned_char,7ul,date::characters_t<char,3ul>&>
               (iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos,
               iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end,
               aliases_t<char,_4UL,_unsigned_char,_7UL> *fmt,characters_t<char,_3UL> *others)

{
  bool bVar1;
  value_type vVar2;
  const_reference pvVar3;
  value_type *pvVar4;
  reference ppcVar5;
  reference pvVar6;
  char *pcVar7;
  char *str_1;
  size_t k_1;
  ulong uStack_88;
  char_type ch;
  size_t i;
  static_string<char,_4UL> *str;
  size_t k;
  undefined1 local_68;
  array<bool,_7UL> is_match;
  array<const_char_*,_7UL> str_list;
  characters_t<char,_3UL> *others_local;
  aliases_t<char,_4UL,_unsigned_char,_7UL> *fmt_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *end_local;
  iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_> *pos_local;
  
  for (str = (static_string<char,_4UL> *)0x0; str < (static_string<char,_4UL> *)0x7;
      str = (static_string<char,_4UL> *)((str->m_data)._M_elems + 1)) {
    pvVar3 = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL>::operator[]
                       (fmt->aliases,(size_type)str);
    pvVar4 = static_string<char,_4UL>::c_str(&pvVar3->first);
    ppcVar5 = std::array<const_char_*,_7UL>::operator[]
                        ((array<const_char_*,_7UL> *)&local_68,(size_type)str);
    *ppcVar5 = pvVar4;
    bVar1 = static_string<char,_4UL>::empty(&pvVar3->first);
    pvVar6 = std::array<bool,_7UL>::operator[]((array<bool,_7UL> *)((long)&k + 1),(size_type)str);
    *pvVar6 = (value_type_conflict4)((bVar1 ^ 0xffU) & 1);
  }
  uStack_88 = 0;
  while( true ) {
    if (3 < uStack_88) {
      return false;
    }
    bVar1 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator==
                      (pos,end);
    if (bVar1) break;
    vVar2 = iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator*(pos)
    ;
    for (str_1 = (char *)0x0; str_1 < (char *)0x7; str_1 = str_1 + 1) {
      pvVar6 = std::array<bool,_7UL>::operator[]
                         ((array<bool,_7UL> *)((long)&k + 1),(size_type)str_1);
      if ((*pvVar6 & 1U) != 0) {
        ppcVar5 = std::array<const_char_*,_7UL>::operator[]
                            ((array<const_char_*,_7UL> *)&local_68,(size_type)str_1);
        if (**ppcVar5 == vVar2) {
          pcVar7 = *ppcVar5 + 1;
          if (*pcVar7 == '\0') {
            iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++
                      (pos);
            pvVar3 = std::array<std::pair<date::static_string<char,_4UL>,_unsigned_char>,_7UL>::
                     operator[](fmt->aliases,(size_type)str_1);
            *fmt->value = pvVar3->second;
            bVar1 = read_impl<date::iterator_proxy<std::istreambuf_iterator<char,std::char_traits<char>>>,char,3ul>
                              (pos,end,others);
            return bVar1;
          }
          ppcVar5 = std::array<const_char_*,_7UL>::operator[]
                              ((array<const_char_*,_7UL> *)&local_68,(size_type)str_1);
          *ppcVar5 = pcVar7;
        }
        else {
          pvVar6 = std::array<bool,_7UL>::operator[]
                             ((array<bool,_7UL> *)((long)&k + 1),(size_type)str_1);
          *pvVar6 = false;
        }
      }
    }
    uStack_88 = uStack_88 + 1;
    iterator_proxy<std::istreambuf_iterator<char,_std::char_traits<char>_>_>::operator++(pos);
  }
  return false;
}

Assistant:

bool read_impl(Iterator& pos, const Iterator& end, aliases_t<Char, Length, Value, Count>& fmt, Others&&... others)
{
    using char_type = typename iterator_traits<Iterator>::value_type;

    std::array<const Char*, Count> str_list;
    std::array<bool, Count> is_match;
    for (std::size_t k = 0; k < Count; ++k)
    {
        const auto& str = fmt.aliases[k].first;
        str_list[k] = str.c_str();
        is_match[k] = !str.empty();
    }

    for (std::size_t i = 0; i < Length; ++i, ++pos)
    {
        if (pos == end)
            return false;

        const char_type ch = *pos;
        for (std::size_t k = 0; k < Count; ++k)
        {
            if (!is_match[k])
                continue;
            
            const Char* str = str_list[k];
            if (*str != ch)
            {
                is_match[k] = false;
                continue;
            }

            ++str;
            if (*str != Char{ '\0' })
            {
                str_list[k] = str;
                continue;
            }

            ++pos;
            fmt.value = fmt.aliases[k].second;
            return read_impl(pos, end, std::forward<Others>(others)...);
        }
    }

    return false;
}